

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcOrientation
          (DeadReckoningCalculator *this,EulerAngles *OrientationOut,KFLOAT32 totalTimeSinceReset)

{
  KFLOAT32 *pKVar1;
  KFLOAT32 KVar2;
  undefined1 local_64 [8];
  TMATRIX curOrientationMatrix;
  TMATRIX DR;
  KFLOAT32 totalTimeSinceReset_local;
  EulerAngles *OrientationOut_local;
  DeadReckoningCalculator *this_local;
  
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
            ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
             (curOrientationMatrix.Data[2] + 1));
  if ((this->m_bQuaxAxisSet & 1U) == 0) {
    computeDRMatrix(this,(TMATRIX *)(curOrientationMatrix.Data[2] + 1),totalTimeSinceReset);
  }
  else {
    computeDRMatrix_asQuat(this,(TMATRIX *)(curOrientationMatrix.Data[2] + 1),totalTimeSinceReset);
  }
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
            ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_64,
             (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
             (curOrientationMatrix.Data[2] + 1),&this->m_initOrientationMatrix);
  matrixToHPR_new((TMATRIX *)local_64,OrientationOut);
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  KVar2 = checkAngleHR(*pKVar1);
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  *pKVar1 = KVar2;
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  KVar2 = checkAngleP(*pKVar1);
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  *pKVar1 = KVar2;
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  KVar2 = checkAngleHR(*pKVar1);
  pKVar1 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  *pKVar1 = KVar2;
  computeRotationAxis(this,(TMATRIX *)local_64);
  return;
}

Assistant:

void DeadReckoningCalculator::calcOrientation( EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset  )
{
    // compute the DR matrix
    TMATRIX DR;
    if (m_bQuaxAxisSet)
        computeDRMatrix_asQuat( DR, totalTimeSinceReset );
    else
        computeDRMatrix( DR, totalTimeSinceReset );

    TMATRIX curOrientationMatrix = DR * m_initOrientationMatrix;
    //TMATRIX curOrientationMatrix = m_initOrientationMatrix;

    matrixToHPR_new( curOrientationMatrix, OrientationOut );
    //matrixToHPR( curOrientationMatrix, m_curOrientation );
    OrientationOut[0] = checkAngleHR( OrientationOut[0]);
    OrientationOut[1] = checkAngleP(OrientationOut[1]);
    OrientationOut[2] = checkAngleHR( OrientationOut[2]);

    computeRotationAxis(curOrientationMatrix);
}